

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O2

UBool ucurr_isAvailable_63(UChar *isoCode,UDate from,UDate to,UErrorCode *eErrorCode)

{
  void *pvVar1;
  
  icu_63::umtx_initOnce(&gIsoCodesInitOnce,initIsoCodes,eErrorCode);
  if ((*eErrorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
     (pvVar1 = uhash_get_63(gIsoCodes,isoCode), pvVar1 != (void *)0x0)) {
    if (from <= to) {
      if ((from < *(double *)((long)pvVar1 + 0x10) || from == *(double *)((long)pvVar1 + 0x10)) &&
         (*(double *)((long)pvVar1 + 8) <= to)) {
        return '\x01';
      }
    }
    else {
      *eErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2
ucurr_isAvailable(const UChar* isoCode, UDate from, UDate to, UErrorCode* eErrorCode) {
    umtx_initOnce(gIsoCodesInitOnce, &initIsoCodes, *eErrorCode);
    if (U_FAILURE(*eErrorCode)) {
        return FALSE;
    }

    IsoCodeEntry* result = (IsoCodeEntry *) uhash_get(gIsoCodes, isoCode);
    if (result == NULL) {
        return FALSE;
    } else if (from > to) {
        *eErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return FALSE;
    } else if  ((from > result->to) || (to < result->from)) {
        return FALSE;
    }
    return TRUE;
}